

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  Instruction *pIVar1;
  int k_00;
  Value *v;
  TValue *io;
  uint uVar2;
  Instruction i;
  TValue k;
  Value local_38;
  undefined4 local_30;
  Value local_28;
  undefined4 local_20;
  
  v = &local_38;
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
  case VFALSE:
    uVar2 = 2;
    if (e->k == VTRUE) {
      uVar2 = 0x800000;
    }
    i = uVar2 | reg << 6 | 3;
LAB_00120c7a:
    luaK_code(fs,i);
    break;
  case VK:
    k_00 = (e->u).info;
    goto LAB_00120d20;
  case VKFLT:
    local_38 = *(Value *)&e->u;
    local_30 = 3;
    goto LAB_00120d14;
  case VKINT:
    local_38 = *(Value *)&e->u;
    local_30 = 2;
    v = &local_28;
    local_20 = 0x13;
    local_28 = local_38;
LAB_00120d14:
    k_00 = addk(fs,(TValue *)&local_38,(TValue *)v);
LAB_00120d20:
    luaK_codek(fs,reg,k_00);
    break;
  case VNONRELOC:
    if ((e->u).info != reg) {
      i = (e->u).info << 0x17 | reg << 6;
      goto LAB_00120c7a;
    }
    break;
  default:
    goto switchD_00120c5e_caseD_8;
  case VRELOCABLE:
    pIVar1 = fs->f->code;
    pIVar1[(e->u).info] = (reg & 0xffU) << 6 | pIVar1[(e->u).info] & 0xffffc03f;
  }
  (e->u).info = reg;
  e->k = VNONRELOC;
switchD_00120c5e_caseD_8:
  return;
}

Assistant:

static void discharge2reg(FuncState *fs, expdesc *e, int reg) {
    luaK_dischargevars(fs, e);
    switch (e->k) {
        case VNIL: {
            luaK_nil(fs, reg, 1);
            break;
        }
        case VFALSE:
        case VTRUE: {
            luaK_codeABC(fs, OP_LOADBOOL, reg, e->k == VTRUE, 0);
            break;
        }
        case VK: {
            luaK_codek(fs, reg, e->u.info);
            break;
        }
        case VKFLT: {
            luaK_codek(fs, reg, luaK_numberK(fs, e->u.nval));
            break;
        }
        case VKINT: {
            luaK_codek(fs, reg, luaK_intK(fs, e->u.ival));
            break;
        }
        case VRELOCABLE: {
            Instruction *pc = &getinstruction(fs, e);
            SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
            break;
        }
        case VNONRELOC: {
            if (reg != e->u.info)
                luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
            break;
        }
        default: {
            lua_assert(e->k == VJMP);
            return;  /* nothing to do... */
        }
    }
    e->u.info = reg;
    e->k = VNONRELOC;
}